

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O0

uint32_t arm_fi_to_sfsc(ARMMMUFaultInfo_conflict1 *fi)

{
  uint local_1c;
  uint32_t fsc;
  ARMMMUFaultInfo_conflict1 *fi_local;
  
  switch(fi->type) {
  case ARMFault_None:
    return 0;
  case ARMFault_AccessFlag:
    local_1c = 6;
    if (fi->level == 1) {
      local_1c = 3;
    }
    break;
  case ARMFault_Alignment:
    local_1c = 1;
    break;
  case ARMFault_Background:
    local_1c = 0;
    break;
  case ARMFault_Domain:
    local_1c = 0xb;
    if (fi->level == 1) {
      local_1c = 9;
    }
    break;
  case ARMFault_Permission:
    local_1c = 0xf;
    if (fi->level == 1) {
      local_1c = 0xd;
    }
    break;
  case ARMFault_Translation:
    local_1c = 7;
    if (fi->level == 1) {
      local_1c = 5;
    }
    break;
  default:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/internals.h"
               ,0x2a3,(char *)0x0);
  case ARMFault_SyncExternal:
    local_1c = (uint)(fi->ea & 1) << 0xc | 8;
    break;
  case ARMFault_SyncExternalOnWalk:
    local_1c = 0xe;
    if (fi->level == 1) {
      local_1c = 0xc;
    }
    local_1c = (uint)(fi->ea & 1) << 0xc | local_1c;
    break;
  case ARMFault_SyncParity:
    local_1c = 0x409;
    break;
  case ARMFault_SyncParityOnWalk:
    local_1c = 0x40e;
    if (fi->level == 1) {
      local_1c = 0x40c;
    }
    break;
  case ARMFault_AsyncParity:
    local_1c = 0x408;
    break;
  case ARMFault_AsyncExternal:
    local_1c = (uint)(fi->ea & 1) << 0xc | 0x406;
    break;
  case ARMFault_Debug:
    local_1c = 2;
    break;
  case ARMFault_TLBConflict:
    local_1c = 0x400;
    break;
  case ARMFault_Lockdown:
    local_1c = 0x404;
    break;
  case ARMFault_Exclusive:
    local_1c = 0x405;
    break;
  case ARMFault_ICacheMaint:
    local_1c = 4;
    break;
  case ARMFault_QEMU_NSCExec:
    local_1c = 0xf;
    break;
  case ARMFault_QEMU_SFault:
    local_1c = 0xe;
  }
  return fi->domain << 4 | local_1c;
}

Assistant:

static inline uint32_t arm_fi_to_sfsc(ARMMMUFaultInfo *fi)
{
    uint32_t fsc = 0;

    switch (fi->type) {
    case ARMFault_None:
        return 0;
    case ARMFault_AccessFlag:
        fsc = fi->level == 1 ? 0x3 : 0x6;
        break;
    case ARMFault_Alignment:
        fsc = 0x1;
        break;
    case ARMFault_Permission:
        fsc = fi->level == 1 ? 0xd : 0xf;
        break;
    case ARMFault_Domain:
        fsc = fi->level == 1 ? 0x9 : 0xb;
        break;
    case ARMFault_Translation:
        fsc = fi->level == 1 ? 0x5 : 0x7;
        break;
    case ARMFault_SyncExternal:
        fsc = 0x8 | (fi->ea << 12);
        break;
    case ARMFault_SyncExternalOnWalk:
        fsc = fi->level == 1 ? 0xc : 0xe;
        fsc |= (fi->ea << 12);
        break;
    case ARMFault_SyncParity:
        fsc = 0x409;
        break;
    case ARMFault_SyncParityOnWalk:
        fsc = fi->level == 1 ? 0x40c : 0x40e;
        break;
    case ARMFault_AsyncParity:
        fsc = 0x408;
        break;
    case ARMFault_AsyncExternal:
        fsc = 0x406 | (fi->ea << 12);
        break;
    case ARMFault_Debug:
        fsc = 0x2;
        break;
    case ARMFault_TLBConflict:
        fsc = 0x400;
        break;
    case ARMFault_Lockdown:
        fsc = 0x404;
        break;
    case ARMFault_Exclusive:
        fsc = 0x405;
        break;
    case ARMFault_ICacheMaint:
        fsc = 0x4;
        break;
    case ARMFault_Background:
        fsc = 0x0;
        break;
    case ARMFault_QEMU_NSCExec:
        fsc = M_FAKE_FSR_NSC_EXEC;
        break;
    case ARMFault_QEMU_SFault:
        fsc = M_FAKE_FSR_SFAULT;
        break;
    default:
        /* Other faults can't occur in a context that requires a
         * short-format status code.
         */
        g_assert_not_reached();
        break;
    }

    fsc |= (fi->domain << 4);
    return fsc;
}